

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextExtTests.cpp
# Opt level: O3

string * __thiscall
deqp::egl::(anonymous_namespace)::eglProfileMaskToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,EGLint mask)

{
  string *psVar1;
  ostringstream stream;
  ostringstream aoStack_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_188);
  if ((int)this == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_188,"<None>",6);
  }
  else {
    if (((ulong)this & 1) == 0) {
      if (((ulong)this & 2) == 0) goto LAB_00200327;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aoStack_188,"EGL_CONTEXT_OPENGL_CORE_PROFILE_BIT_KHR",0x27);
      if (((ulong)this & 2) == 0) goto LAB_00200327;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_188,"|",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aoStack_188,"EGL_CONTEXT_OPENGL_COMPATIBILITY_PROFILE_BIT_KHR",0x30);
  }
LAB_00200327:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_188);
  psVar1 = (string *)std::ios_base::~ios_base(local_118);
  return psVar1;
}

Assistant:

string eglProfileMaskToString (EGLint mask)
{
	std::ostringstream	stream;

	if (mask == 0)
		stream << "<None>";
	else
	{
		bool first = true;

		if ((mask & EGL_CONTEXT_OPENGL_CORE_PROFILE_BIT_KHR) != 0)
		{
			if (!first)
				stream << "|";

			first = false;

			stream << "EGL_CONTEXT_OPENGL_CORE_PROFILE_BIT_KHR";
		}

		if ((mask & EGL_CONTEXT_OPENGL_COMPATIBILITY_PROFILE_BIT_KHR) != 0)
		{
			if (!first)
				stream << "|";

			stream << "EGL_CONTEXT_OPENGL_COMPATIBILITY_PROFILE_BIT_KHR";
		}
	}

	return stream.str();
}